

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout_mapping_right.hpp
# Opt level: O0

size_type __thiscall
std::experimental::
layout_mapping_right<std::experimental::dimensions<6ul,30ul>,std::experimental::dimensions<5ul,1ul>,std::experimental::dimensions<1ul,1ul>>
::index<int,int>(layout_mapping_right<std::experimental::dimensions<6ul,30ul>,std::experimental::dimensions<5ul,1ul>,std::experimental::dimensions<1ul,1ul>>
                 *this,int idx,int idx_1)

{
  size_type sVar1;
  undefined1 local_30 [8];
  make_filled_dims_t<dimensions<6UL,_30UL>::rank(),_dyn> i;
  layout_mapping_right_indexer<std::experimental::dimensions<6UL,_30UL>,_std::experimental::dimensions<5UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>,_0UL,_void>
  indexer;
  int idx_local_1;
  int idx_local;
  layout_mapping_right<std::experimental::dimensions<6UL,_30UL>,_std::experimental::dimensions<5UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>_>
  *this_local;
  
  dimensions<18446744073709551615UL,_18446744073709551615UL>::dimensions<int,_int,_nullptr>
            ((dimensions<18446744073709551615UL,_18446744073709551615UL> *)local_30,idx,idx_1);
  sVar1 = detail::
          layout_mapping_right_indexer<std::experimental::dimensions<6ul,30ul>,std::experimental::dimensions<5ul,1ul>,std::experimental::dimensions<1ul,1ul>,0ul,void>
          ::operator()((layout_mapping_right_indexer<std::experimental::dimensions<6ul,30ul>,std::experimental::dimensions<5ul,1ul>,std::experimental::dimensions<1ul,1ul>,0ul,void>
                        *)((long)i.dynamic_dims_._M_elems + 0xf),local_30,
                       i.dynamic_dims_._M_elems[0]);
  return sVar1;
}

Assistant:

inline typename Dimensions::size_type
layout_mapping_right<Dimensions, Stepping, Padding>::index(
    Idx... idx
    ) const noexcept
{
    // TODO: These static asserts need to actually live in mdspan. The
    // first one is particularly important, otherwise it will silently do the
    // wrong thing.
    static_assert(
        Dimensions::rank() == sizeof...(idx)
      , "Incorrect number of indices passed to layout_mapping_right."
    );

    detail::layout_mapping_right_indexer<Dimensions, Stepping, Padding, 0> indexer;
    auto i = detail::make_filled_dims_t<Dimensions::rank(), dyn>(idx...);

    return indexer(*static_cast<Dimensions const*>(this), step_, pad_, i);
}